

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O1

MDD lddmc_makenode(uint32_t value,MDD ifeq,MDD ifneq)

{
  long *plVar1;
  uint64_t a;
  uint64_t b;
  MDD MVar2;
  llmsset_t plVar3;
  long in_FS_OFFSET;
  int created;
  mddnode n;
  undefined1 auStack_c0 [64];
  code *pcStack_80;
  int local_6c;
  int6 local_68;
  undefined4 uStack_62;
  undefined6 uStack_5e;
  Task local_58;
  
  MVar2 = ifneq;
  if (ifeq != 0) {
    if (ifneq != 0) {
      if (ifneq == 1) {
        pcStack_80 = (code *)0x111828;
        __assert_fail("ifneq != lddmc_true",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0x166,"MDD lddmc_makenode(uint32_t, MDD, MDD)");
      }
      if (*(uint *)(nodes->data + ifneq * 0x10 + 6) <= value) {
        pcStack_80 = (code *)0x111847;
        __assert_fail("value < mddnode_getvalue(LDD_GETNODE(ifneq))",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0x167,"MDD lddmc_makenode(uint32_t, MDD, MDD)");
      }
    }
    local_68 = (int6)ifneq * 2;
    uStack_5e = (undefined6)((ifeq << 0x11) >> 0x10);
    uStack_62._0_2_ = (undefined2)value;
    uStack_62._2_2_ = (undefined2)(value >> 0x10);
    a = CONCAT26((undefined2)uStack_62,local_68);
    b = CONCAT62(uStack_5e,uStack_62._2_2_);
    pcStack_80 = (code *)0x11179e;
    uStack_62 = value;
    MVar2 = llmsset_lookup(nodes,a,b,&local_6c);
    if (MVar2 == 0) {
      pcStack_80 = (code *)0x1117ab;
      lddmc_refs_push(ifeq);
      pcStack_80 = (code *)0x1117b3;
      lddmc_refs_push(ifneq);
      local_58.f = sylvan_gc_WRAP;
      local_58.thief = (_Worker *)0x1;
      pcStack_80 = (code *)0x1117cf;
      lace_run_task(&local_58);
      plVar1 = (long *)(*(long *)(in_FS_OFFSET + -0x20) + 0x28);
      *plVar1 = *plVar1 + -8;
      pcStack_80 = (code *)0x1117f4;
      plVar3 = nodes;
      MVar2 = llmsset_lookup(nodes,CONCAT26((undefined2)uStack_62,local_68),
                             CONCAT62(uStack_5e,uStack_62._2_2_),&local_6c);
      if (MVar2 == 0) {
        pcStack_80 = llmsset_count_marked_RUN;
        lddmc_makenode_cold_1();
        auStack_c0._0_8_ = llmsset_count_marked_WRAP;
        auStack_c0._8_8_ = (_Worker *)0x1;
        auStack_c0._16_8_ = plVar3;
        pcStack_80 = (code *)ifneq;
        lace_run_task((Task *)auStack_c0);
        return (MDD)(llmsset_t)auStack_c0._16_8_;
      }
    }
  }
  return MVar2;
}

Assistant:

MDD
lddmc_makenode(uint32_t value, MDD ifeq, MDD ifneq)
{
    if (ifeq == lddmc_false) return ifneq;

    // check if correct (should be false, or next in value)
    assert(ifneq != lddmc_true);
    if (ifneq != lddmc_false) assert(value < mddnode_getvalue(LDD_GETNODE(ifneq)));

    struct mddnode n;
    mddnode_make(&n, value, ifneq, ifeq);

    int created;
    uint64_t index = llmsset_lookup(nodes, n.a, n.b, &created);
    if (index == 0) {
        lddmc_refs_push(ifeq);
        lddmc_refs_push(ifneq);
        RUN(sylvan_gc);
        lddmc_refs_pop(1);

        index = llmsset_lookup(nodes, n.a, n.b, &created);
        if (index == 0) {
            fprintf(stderr, "MDD Unique table full, %zu of %zu buckets filled!\n", llmsset_count_marked(nodes), llmsset_get_size(nodes));
            exit(1);
        }
    }

    if (created) sylvan_stats_count(LDD_NODES_CREATED);
    else sylvan_stats_count(LDD_NODES_REUSED);

    return (MDD)index;
}